

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_4UL>_> *this,double t,array<float,_4UL> *v)

{
  Sample s;
  Sample local_28;
  
  local_28.blocked = false;
  local_28.value._M_elems._0_8_ = *(undefined8 *)v->_M_elems;
  local_28.value._M_elems._8_8_ = *(undefined8 *)(v->_M_elems + 2);
  local_28.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
              *)this,&local_28);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }